

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaCom.c
# Opt level: O0

int Cba_CommandPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Cba_Man_t *p_00;
  Cba_Ntk_t *pCVar4;
  char *pcVar5;
  uint local_48;
  int fVerbose;
  int c;
  int fDistrib;
  int fShowAdder;
  int fShowMulti;
  int nModules;
  Cba_Man_t *p;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p_00 = Cba_AbcGetMan(pAbc);
  fShowAdder = 0;
  bVar1 = false;
  bVar2 = false;
  fVerbose = 0;
  local_48 = 0;
  Extra_UtilGetoptReset();
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"Mmadvh");
    if (iVar3 == -1) {
      if (p_00 == (Cba_Man_t *)0x0) {
        Abc_Print(1,"Cba_CommandPs(): There is no current design.\n");
        return 0;
      }
      if (fShowAdder != 0) {
        Cba_ManPrintStats(p_00,fShowAdder,local_48);
        return 0;
      }
      pCVar4 = Cba_ManRoot(p_00);
      Cba_NtkPrintStatsFull(pCVar4,fVerbose,local_48);
      if (bVar1) {
        pCVar4 = Cba_ManRoot(p_00);
        Cba_NtkPrintNodes(pCVar4,0x31);
      }
      if (bVar2) {
        pCVar4 = Cba_ManRoot(p_00);
        Cba_NtkPrintNodes(pCVar4,0x2f);
      }
      return 0;
    }
    switch(iVar3) {
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
        goto LAB_003cb5d1;
      }
      fShowAdder = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fShowAdder < 0) {
LAB_003cb5d1:
        Abc_Print(-2,"usage: @ps [-M num] [-madvh]\n");
        Abc_Print(-2,"\t         prints statistics\n");
        Abc_Print(-2,"\t-M num : the number of first modules to report [default = %d]\n",
                  (ulong)(uint)fShowAdder);
        pcVar5 = "no";
        if (bVar1) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-m     : toggle printing multipliers [default = %s]\n",pcVar5);
        pcVar5 = "no";
        if (bVar2) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-a     : toggle printing adders [default = %s]\n",pcVar5);
        pcVar5 = "no";
        if (fVerbose != 0) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-d     : toggle printing distrubition [default = %s]\n",pcVar5);
        pcVar5 = "no";
        if (local_48 != 0) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_003cb5d1;
    case 0x61:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 100:
      fVerbose = fVerbose ^ 1;
      break;
    case 0x68:
      goto LAB_003cb5d1;
    case 0x6d:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x76:
      local_48 = local_48 ^ 1;
    }
  } while( true );
}

Assistant:

int Cba_CommandPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cba_Man_t * p = Cba_AbcGetMan(pAbc);
    int nModules     = 0;
    int fShowMulti   = 0;
    int fShowAdder   = 0;
    int fDistrib     = 0;
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Mmadvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nModules = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nModules < 0 )
                goto usage;
            break;
        case 'm':
            fShowMulti ^= 1;
            break;
        case 'a':
            fShowAdder ^= 1;
            break;
        case 'd':
            fDistrib ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Cba_CommandPs(): There is no current design.\n" );
        return 0;
    }
    if ( nModules )
    {
        Cba_ManPrintStats( p, nModules, fVerbose );
        return 0;
    }
    Cba_NtkPrintStatsFull( Cba_ManRoot(p), fDistrib, fVerbose );
    if ( fShowMulti )
        Cba_NtkPrintNodes( Cba_ManRoot(p), CBA_BOX_MUL );
    if ( fShowAdder )
        Cba_NtkPrintNodes( Cba_ManRoot(p), CBA_BOX_ADD );
    return 0;
usage:
    Abc_Print( -2, "usage: @ps [-M num] [-madvh]\n" );
    Abc_Print( -2, "\t         prints statistics\n" );
    Abc_Print( -2, "\t-M num : the number of first modules to report [default = %d]\n", nModules );
    Abc_Print( -2, "\t-m     : toggle printing multipliers [default = %s]\n",         fShowMulti? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle printing adders [default = %s]\n",              fShowAdder? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle printing distrubition [default = %s]\n",        fDistrib? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}